

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::instrumentFuncs(Instrumenter *this)

{
  StorageKind SVar1;
  pointer puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  pointer puVar8;
  Function *pFVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  Expression *right;
  Const *pCVar13;
  Const *pCVar14;
  Expression *pEVar15;
  Block *pBVar16;
  Fatal *this_00;
  uint uVar17;
  ulong uVar18;
  pointer pNVar19;
  pointer puVar20;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  Memory *pMVar21;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  undefined1 local_210 [392];
  uintptr_t uStack_88;
  Name memoryName;
  char *command;
  Builder local_38;
  Builder builder;
  
  local_38.wasm = this->wasm;
  SVar1 = this->config->storageKind;
  if (SVar1 - InMemory < 2) {
    if ((((local_38.wasm)->features).features & 1) == 0) {
      pcVar4 = "--in-secondary-memory";
      if (SVar1 == InMemory) {
        pcVar4 = "--in-memory";
      }
      memoryName.super_IString.str._M_str = pcVar4 + 2;
      Fatal::Fatal((Fatal *)local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_210 + 0x10),"error: --",9);
      this_00 = Fatal::operator<<((Fatal *)local_210,&memoryName.super_IString.str._M_str);
      Fatal::operator<<(this_00,(char (*) [32])" requires atomics to be enabled");
      Fatal::~Fatal((Fatal *)local_210);
    }
    puVar2 = ((local_38.wasm)->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar2 == ((local_38.wasm)->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!wasm->memories.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/instrumenter.cpp"
                    ,0x8e,"void wasm::Instrumenter::instrumentFuncs()");
    }
    if (SVar1 == InMemory) {
      pMVar21 = (puVar2->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    }
    else {
      pMVar21 = (Memory *)&this->secondaryMemory;
    }
    uStack_88 = *(uintptr_t *)&(pMVar21->super_Importable).super_Named.name;
    memoryName.super_IString.str._M_len =
         *(size_t *)((long)&(pMVar21->super_Importable).super_Named.name + 8);
    puVar20 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = ((local_38.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar8) {
      uVar17 = 0;
      do {
        pFVar9 = (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar9->super_Importable).module + 8) == (char *)0x0) {
          pCVar13 = Builder::makeConstPtr(&local_38,0,(Type)0x2);
          pCVar14 = Builder::makeConst<unsigned_int>(&local_38,1);
          pEVar15 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
          *(undefined8 *)pEVar15 = 0;
          (pEVar15->type).id = 0;
          *(undefined8 *)(pEVar15 + 2) = 0;
          pEVar15[2].type.id = 0;
          *(undefined8 *)(pEVar15 + 1) = 0;
          pEVar15[1].type.id = 0;
          *(undefined8 *)(pEVar15 + 3) = 0;
          pEVar15[3].type.id = 0;
          *(undefined8 *)(pEVar15 + 4) = 0;
          pEVar15[4].type.id = 0;
          *(undefined8 *)(pEVar15 + 5) = 0;
          pEVar15->_id = StoreId;
          (pEVar15->type).id = 0;
          pEVar15[1].type.id = 0;
          *(undefined8 *)(pEVar15 + 2) = 0;
          *(undefined1 *)&pEVar15[2].type.id = 0;
          pEVar15[1]._id = BlockId;
          pEVar15[1].type.id = (ulong)uVar17;
          *(undefined8 *)(pEVar15 + 2) = 1;
          *(Const **)(pEVar15 + 3) = pCVar13;
          pEVar15[3].type.id = (uintptr_t)pCVar14;
          *(undefined8 *)(pEVar15 + 4) = 2;
          pEVar15[4].type.id = uStack_88;
          *(size_t *)(pEVar15 + 5) = memoryName.super_IString.str._M_len;
          wasm::Store::finalize();
          *(undefined1 *)&pEVar15[2].type.id = 1;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)(pFVar9->body->type).id;
          pBVar16 = Builder::makeSequence(&local_38,pEVar15,pFVar9->body,type_01);
          pFVar9->body = (Expression *)pBVar16;
          uVar17 = uVar17 + 1;
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar8);
    }
  }
  else if (SVar1 == InGlobals) {
    puVar20 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = ((local_38.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar8) {
      pNVar19 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pFVar9 = (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar9->super_Importable).module + 8) == (char *)0x0) {
          uVar3 = (pNVar19->super_IString).str._M_len;
          pcVar4 = (pNVar19->super_IString).str._M_str;
          puVar10 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar10 = 10;
          *(undefined8 *)(puVar10 + 8) = 0;
          *(undefined8 *)(puVar10 + 0x10) = 0;
          *(undefined8 *)(puVar10 + 0x10) = uVar3;
          *(char **)(puVar10 + 0x18) = pcVar4;
          *(undefined8 *)(puVar10 + 8) = 2;
          puVar11 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar11 = 0xf;
          *(undefined8 *)(puVar11 + 8) = 0;
          *(undefined4 *)(puVar11 + 0x10) = 0x14;
          *(undefined1 **)(puVar11 + 0x18) = puVar10;
          wasm::Unary::finalize();
          sVar5 = (this->counterGlobal).super_IString.str._M_len;
          pcVar4 = (this->counterGlobal).super_IString.str._M_str;
          puVar10 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar10 = 10;
          *(undefined8 *)(puVar10 + 8) = 0;
          *(undefined8 *)(puVar10 + 0x10) = 0;
          *(size_t *)(puVar10 + 0x10) = sVar5;
          *(char **)(puVar10 + 0x18) = pcVar4;
          *(undefined8 *)(puVar10 + 8) = 2;
          wasm::Literal::makeOne((Type)local_210);
          pCVar13 = Builder::makeConst(&local_38,(Literal *)local_210);
          puVar12 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          *puVar12 = 0x10;
          *(undefined8 *)(puVar12 + 8) = 0;
          *(undefined4 *)(puVar12 + 0x10) = 0;
          *(undefined1 **)(puVar12 + 0x18) = puVar10;
          *(Const **)(puVar12 + 0x20) = pCVar13;
          wasm::Binary::finalize();
          pEVar15 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar15->_id = GlobalSetId;
          (pEVar15->type).id = 0;
          *(undefined8 *)(pEVar15 + 1) = 0;
          *(size_t *)(pEVar15 + 1) = sVar5;
          pEVar15[1].type.id = (uintptr_t)pcVar4;
          *(undefined1 **)(pEVar15 + 2) = puVar12;
          wasm::GlobalSet::finalize();
          uVar6 = (pNVar19->super_IString).str._M_len;
          pcVar4 = (pNVar19->super_IString).str._M_str;
          sVar5 = (this->counterGlobal).super_IString.str._M_len;
          pcVar7 = (this->counterGlobal).super_IString.str._M_str;
          uVar18 = uVar6;
          puVar10 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar10 = 10;
          *(undefined8 *)(puVar10 + 8) = 0;
          *(undefined8 *)(puVar10 + 0x10) = 0;
          *(size_t *)(puVar10 + 0x10) = sVar5;
          *(char **)(puVar10 + 0x18) = pcVar7;
          *(undefined8 *)(puVar10 + 8) = 2;
          right = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          right->_id = GlobalSetId;
          (right->type).id = 0;
          *(undefined8 *)(right + 1) = 0;
          *(ulong *)(right + 1) = uVar6;
          right[1].type.id = (uintptr_t)pcVar4;
          *(undefined1 **)(right + 2) = puVar10;
          wasm::GlobalSet::finalize();
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar18;
          pBVar16 = Builder::makeSequence(&local_38,pEVar15,right,type);
          pEVar15 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar15->_id = IfId;
          (pEVar15->type).id = 0;
          *(undefined8 *)(pEVar15 + 2) = 0;
          *(undefined1 **)(pEVar15 + 1) = puVar11;
          pEVar15[1].type.id = (uintptr_t)pBVar16;
          wasm::If::finalize(pEVar15);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)(pFVar9->body->type).id;
          pBVar16 = Builder::makeSequence(&local_38,pEVar15,pFVar9->body,type_00);
          pFVar9->body = (Expression *)pBVar16;
          wasm::Literal::~Literal((Literal *)local_210);
          pNVar19 = pNVar19 + 1;
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar8);
    }
  }
  return;
}

Assistant:

void Instrumenter::instrumentFuncs() {
  // Inject code at the beginning of each function to advance the monotonic
  // counter and set the function's timestamp if it hasn't already been set.
  Builder builder(*wasm);
  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      // (if (i32.eqz (global.get $timestamp))
      //   (block
      //     (global.set $monotonic_counter
      //       (i32.add
      //         (global.get $monotonic_counter)
      //         (i32.const 1)
      //       )
      //     )
      //     (global.set $timestamp
      //       (global.get $monotonic_counter)
      //     )
      //   )
      // )
      auto globalIt = functionGlobals.begin();
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeIf(
            builder.makeUnary(EqZInt32,
                              builder.makeGlobalGet(*globalIt, Type::i32)),
            builder.makeSequence(
              builder.makeGlobalSet(
                counterGlobal,
                builder.makeBinary(
                  AddInt32,
                  builder.makeGlobalGet(counterGlobal, Type::i32),
                  builder.makeConst(Literal::makeOne(Type::i32)))),
              builder.makeGlobalSet(
                *globalIt, builder.makeGlobalGet(counterGlobal, Type::i32)))),
          func->body,
          func->body->type);
        ++globalIt;
      });
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      if (!wasm->features.hasAtomics()) {
        const char* command =
          config.storageKind == WasmSplitOptions::StorageKind::InMemory
            ? "in-memory"
            : "in-secondary-memory";
        Fatal() << "error: --" << command << " requires atomics to be enabled";
      }
      // (i32.atomic.store8 offset=funcidx (i32.const 0) (i32.const 1))
      Index funcIdx = 0;
      assert(!wasm->memories.empty());
      Name memoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeAtomicStore(1,
                                  funcIdx,
                                  builder.makeConstPtr(0, Type::i32),
                                  builder.makeConst(uint32_t(1)),
                                  Type::i32,
                                  memoryName),
          func->body,
          func->body->type);
        ++funcIdx;
      });
      break;
    }
  }
}